

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPrettyPrinter.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_27c2e2::TestcaseBase::TestcaseBase(TestcaseBase *this)

{
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  binlog::detail::OstreamBuffer::OstreamBuffer(&this->buf,(ostream *)this);
  return;
}

Assistant:

TestcaseBase()
  {
    std::ostringstream argsBufferStream;
    mserialize::serialize(111, argsBufferStream);
    mserialize::serialize(std::string("foo"), argsBufferStream);
    argsBuffer = argsBufferStream.str();
    event.arguments = binlog::Range(argsBuffer.data(), argsBuffer.data() + argsBuffer.size());
  }